

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CuTest.c
# Opt level: O0

void CuSuiteDetails(CuSuite *testSuite,CuString *details)

{
  CuTest *pCVar1;
  uint uVar2;
  char *pcVar3;
  CuTest *testCase;
  char *testWord;
  uint local_20;
  int passCount;
  int failCount;
  int i;
  CuString *details_local;
  CuSuite *testSuite_local;
  
  local_20 = 0;
  if (testSuite->failCount == 0) {
    uVar2 = testSuite->count - testSuite->failCount;
    pcVar3 = "tests";
    if (uVar2 == 1) {
      pcVar3 = "test";
    }
    CuStringAppendFormat(details,"OK (%d %s)\n",(ulong)uVar2,pcVar3);
  }
  else {
    if (testSuite->failCount == 1) {
      CuStringAppend(details,"There was 1 failure:\n");
    }
    else {
      CuStringAppendFormat(details,"There were %d failures:\n",(ulong)(uint)testSuite->failCount);
    }
    for (passCount = 0; passCount < testSuite->count; passCount = passCount + 1) {
      pCVar1 = testSuite->list[passCount];
      if (pCVar1->failed != 0) {
        local_20 = local_20 + 1;
        CuStringAppendFormat(details,"%d) %s: %s\n",(ulong)local_20,pCVar1->name,pCVar1->message);
      }
    }
    CuStringAppend(details,"\n!!!FAILURES!!!\n");
    CuStringAppendFormat(details,"Runs: %d ",(ulong)(uint)testSuite->count);
    CuStringAppendFormat
              (details,"Passes: %d ",(ulong)(uint)(testSuite->count - testSuite->failCount));
    CuStringAppendFormat(details,"Fails: %d\n",(ulong)(uint)testSuite->failCount);
  }
  return;
}

Assistant:

void CuSuiteDetails(CuSuite* testSuite, CuString* details)
{
	int i;
	int failCount = 0;

	if (testSuite->failCount == 0)
	{
		int passCount = testSuite->count - testSuite->failCount;
		const char* testWord = passCount == 1 ? "test" : "tests";
		CuStringAppendFormat(details, "OK (%d %s)\n", passCount, testWord);
	}
	else
	{
		if (testSuite->failCount == 1)
			CuStringAppend(details, "There was 1 failure:\n");
		else
			CuStringAppendFormat(details, "There were %d failures:\n", testSuite->failCount);

		for (i = 0 ; i < testSuite->count ; ++i)
		{
			CuTest* testCase = testSuite->list[i];
			if (testCase->failed)
			{
				failCount++;
				CuStringAppendFormat(details, "%d) %s: %s\n",
					failCount, testCase->name, testCase->message);
			}
		}
		CuStringAppend(details, "\n!!!FAILURES!!!\n");

		CuStringAppendFormat(details, "Runs: %d ",   testSuite->count);
		CuStringAppendFormat(details, "Passes: %d ", testSuite->count - testSuite->failCount);
		CuStringAppendFormat(details, "Fails: %d\n",  testSuite->failCount);
	}
}